

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int certificate_type_exists(uint8_t *list,size_t count,uint8_t desired_type)

{
  size_t i;
  uint8_t desired_type_local;
  size_t count_local;
  uint8_t *list_local;
  int local_4;
  
  if ((desired_type == '\0') && (count == 0)) {
    local_4 = 1;
  }
  else {
    for (i = 0; i < count; i = i + 1) {
      if (list[i] == desired_type) {
        return 1;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int certificate_type_exists(uint8_t *list, size_t count, uint8_t desired_type)
{
    /* empty type list means that we default to x509 */
    if (desired_type == PTLS_CERTIFICATE_TYPE_X509 && count == 0)
        return 1;
    for (size_t i = 0; i < count; i++) {
        if (list[i] == desired_type)
            return 1;
    }
    return 0;
}